

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O2

bool __thiscall
ExecutorX86::TranslateToNative(ExecutorX86 *this,bool enableLogFiles,OutputContext *output)

{
  FastVector<unsigned_char_*,_false,_false> *this_00;
  Linker *linker;
  uchar *puVar1;
  int iVar2;
  CodeGenRegVmContext *pCVar3;
  uint *puVar4;
  ExternFuncInfo *pEVar5;
  byte *pbVar6;
  RegVmCmd *pRVar7;
  ulong uVar8;
  x86Instruction *pxVar9;
  void *pvVar10;
  uchar *puVar11;
  uchar **ppuVar12;
  ExpiredFunctionAddressList *pEVar13;
  x86Instruction *pxVar14;
  uint i_1;
  uint uVar15;
  uint uVar16;
  undefined7 in_register_00000031;
  uint i;
  uint uVar17;
  FastVector<unsigned_char_*,_false,_false> *pFVar18;
  char cVar19;
  FastVector<unsigned_int,_false,_false> *pFVar20;
  int regId;
  int iVar21;
  FastVector<x86Instruction,_true,_true> *pFVar22;
  uchar *puVar23;
  bool bVar24;
  uint pos;
  FastVector<unsigned_int,_false,_false> *local_a0;
  FastVector<unsigned_char_*,_false,_false> *local_98;
  uint local_8c;
  OutputContext *local_88;
  FastVector<x86Instruction,_true,_true> *local_80;
  FastVector<unsigned_int,_false,_false> *local_78;
  undefined4 local_6c;
  FastVector<unsigned_int,_false,_false> *local_68;
  RegVmCmd *local_60;
  TraceScope traceScope;
  ExpiredFunctionAddressList info;
  
  local_6c = (undefined4)CONCAT71(in_register_00000031,enableLogFiles);
  local_88 = output;
  if ((TranslateToNative(bool,OutputContext&)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TranslateToNative(bool,OutputContext&)::token), iVar2 != 0)) {
    TranslateToNative::token = NULLC::TraceGetToken("x86","TranslateToNative");
    __cxa_guard_release(&TranslateToNative(bool,OutputContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,TranslateToNative::token);
  pFVar22 = &this->instList;
  uVar8 = (ulong)(this->instList).count;
  if (uVar8 != 0) {
    NULLC::fillMemory(pFVar22->data,0,uVar8 * 0x50);
  }
  (this->instList).count = 0;
  FastVector<x86Instruction,_true,_true>::reserve(pFVar22,0x40);
  pCVar3 = this->codeGenCtx;
  if (pCVar3 == (CodeGenRegVmContext *)0x0) {
    pCVar3 = (CodeGenRegVmContext *)(*(code *)NULLC::alloc)(0xa30);
    CodeGenRegVmContext::CodeGenRegVmContext(pCVar3);
    this->codeGenCtx = pCVar3;
  }
  pCVar3->x86rvm = this;
  pCVar3->exFunctions = this->exFunctions->data;
  pCVar3->exTypes = this->exTypes->data;
  linker = this->exLinker;
  pCVar3->exTypeExtra = (linker->exTypeExtra).data;
  pCVar3->exLocals = (linker->exLocals).data;
  pFVar20 = this->exRegVmConstants;
  puVar4 = pFVar20->data;
  pCVar3->exRegVmConstants = puVar4;
  pCVar3->exRegVmConstantsEnd = puVar4 + pFVar20->count;
  pCVar3->exRegVmRegKillInfo = this->exRegVmRegKillInfo->data;
  pCVar3->exSymbols = (linker->exSymbols).data;
  pCVar3->vmState = &this->vmState;
  (this->vmState).ctx = pCVar3;
  (this->vmState).exRegVmConstants = puVar4;
  pxVar14 = (this->instList).data;
  (pCVar3->ctx).x86Op = pxVar14;
  (pCVar3->ctx).x86Base = pxVar14;
  CommonSetLinker(linker);
  EMIT_OP(&this->codeGenCtx->ctx,o_use32);
  pFVar20 = &this->codeJumpTargets;
  FastVector<unsigned_int,_false,_false>::resize(pFVar20,this->exRegVmCode->count);
  if ((this->codeJumpTargets).count != 0) {
    puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,this->lastInstructionCount);
    NULLC::fillMemory(puVar4,0,(ulong)((this->codeJumpTargets).count - this->lastInstructionCount)
                               << 2);
  }
  info.data = (uchar **)((ulong)info.data._4_4_ << 0x20);
  FastVector<unsigned_int,_false,_false>::push_back(pFVar20,(uint *)&info);
  uVar17 = (this->exLinker->regVmJumpTargets).count;
  for (uVar15 = this->oldJumpTargetCount; uVar17 != uVar15; uVar15 = uVar15 + 1) {
    puVar4 = FastVector<unsigned_int,_false,_false>::operator[]
                       (&this->exLinker->regVmJumpTargets,uVar15);
    puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,*puVar4);
    *puVar4 = 1;
  }
  uVar15 = (this->exLinker->exFunctions).count;
  uVar17 = 2;
  local_a0 = pFVar20;
  local_80 = pFVar22;
  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
    pEVar5 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       (&this->exLinker->exFunctions,uVar16);
    if (((pEVar5->regVmAddress != 0xffffffff) && (pEVar5->regVmCodeSize != 0)) &&
       (puVar4 = FastVector<unsigned_int,_false,_false>::operator[](local_a0,pEVar5->regVmAddress),
       *puVar4 < 0x100)) {
      puVar4 = FastVector<unsigned_int,_false,_false>::operator[](local_a0,pEVar5->regVmAddress);
      *puVar4 = *puVar4 | uVar17;
    }
    uVar17 = uVar17 + 0x100;
  }
  local_68 = &this->codeRegKillInfoOffsets;
  FastVector<unsigned_int,_false,_false>::resize(local_68,this->exRegVmCode->count);
  pFVar20 = local_a0;
  uVar17 = this->exRegVmCode->count;
  for (uVar15 = this->lastInstructionCount; pFVar22 = local_80, uVar16 = this->oldRegKillInfoCount,
      uVar17 != uVar15; uVar15 = uVar15 + 1) {
    puVar4 = FastVector<unsigned_int,_false,_false>::operator[](local_68,uVar15);
    *puVar4 = uVar16;
    pbVar6 = FastVector<unsigned_char,_false,_false>::operator[]
                       (this->exRegVmRegKillInfo,this->oldRegKillInfoCount);
    this->oldRegKillInfoCount =
         (*pbVar6 & 0xf) + (uint)(*pbVar6 >> 4) + this->oldRegKillInfoCount + 1;
  }
  if (uVar16 != this->exRegVmRegKillInfo->count) {
    __assert_fail("oldRegKillInfoCount == exRegVmRegKillInfo.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                  ,0x53c,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
  }
  uVar15 = this->exFunctions->count;
  if ((this->codeRunning == true) && ((this->functionAddress).max <= uVar15)) {
    info.data = (this->functionAddress).data;
    info.count = (this->functionAddress).count;
    FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::push_back
              (&this->expiredFunctionAddressLists,&info);
    pFVar18 = &this->functionAddress;
    pFVar18->data = (uchar **)0x0;
    (this->functionAddress).max = 0;
    (this->functionAddress).count = 0;
    FastVector<unsigned_char_*,_false,_false>::resize(pFVar18,this->exFunctions->count);
    for (uVar15 = 0; pFVar22 = local_80, uVar15 < this->oldFunctionSize; uVar15 = uVar15 + 1) {
      pEVar5 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,uVar15);
      if (pEVar5->regVmAddress == -1) {
        puVar11 = (uchar *)0x0;
      }
      else {
        pEVar5 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,uVar15);
        ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[]
                             (&this->instAddress,pEVar5->regVmAddress);
        puVar11 = *ppuVar12;
      }
      ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[](pFVar18,uVar15);
      *ppuVar12 = puVar11;
      pFVar20 = local_a0;
    }
  }
  else {
    FastVector<unsigned_char_*,_false,_false>::resize(&this->functionAddress,uVar15);
  }
  (this->vmState).functionAddress = (this->functionAddress).data;
  local_8c = 0;
  SetOptimizationLookBehind(&this->codeGenCtx->ctx,false);
  pFVar18 = &this->functionAddress;
  pos = this->lastInstructionCount;
  local_78 = &this->globalCodeRanges;
  local_98 = pFVar18;
  while (pos < this->exRegVmCode->count) {
    pRVar7 = FastVector<RegVmCmd,_false,_false>::operator[](this->exRegVmCode,pos);
    pCVar3 = this->codeGenCtx;
    pxVar14 = (this->instList).data;
    uVar8 = ((long)(pCVar3->ctx).x86Op - (long)pxVar14) / 0x50;
    uVar15 = (uint)uVar8;
    (this->instList).count = uVar15;
    uVar15 = uVar15 + 0x40;
    if ((this->instList).max <= uVar15) {
      FastVector<x86Instruction,_true,_true>::grow(pFVar22,uVar15);
      pCVar3 = this->codeGenCtx;
      pxVar14 = (this->instList).data;
    }
    uVar8 = uVar8 & 0xffffffff;
    (pCVar3->ctx).x86Op = pxVar14 + uVar8;
    (pCVar3->ctx).x86Base = pxVar14;
    pxVar14[uVar8].instID = pos + 1;
    puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,pos);
    if (*puVar4 != 0) {
      SetOptimizationLookBehind(&this->codeGenCtx->ctx,false);
    }
    this->codeGenCtx->currInstructionPos = pos;
    puVar4 = FastVector<unsigned_int,_false,_false>::operator[](local_68,pos);
    this->codeGenCtx->currInstructionRegKillOffset = *puVar4;
    puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,pos);
    local_60 = pRVar7;
    if ((*puVar4 & 6) != 0) {
      puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,pos);
      pCVar3 = this->codeGenCtx;
      if ((*puVar4 & 4) != 0) {
        local_8c = pos;
        pCVar3->currFunctionId = 0;
      }
      EMIT_OP_NUM(&pCVar3->ctx,o_set_tracking,0);
      EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rEBX);
      EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rR15);
      EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_sub64,rESP,0x28);
      EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
      puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,pos);
      if ((*puVar4 & 2) != 0) {
        puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,pos);
        uVar15 = *puVar4;
        this->codeGenCtx->currFunctionId = uVar15 >> 8;
        pEVar5 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                           (&this->exLinker->exFunctions,uVar15 >> 8);
        uVar15 = pEVar5->argumentSize;
        uVar17 = pEVar5->stackSize;
        EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,0);
        EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rEBX,sQWORD,rR13,0x140);
        EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rR15,sQWORD,rR13,0x108);
        EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_mov64,rEAX,sQWORD,rR13,0x100);
        EMIT_OP_RPTR_REG(&this->codeGenCtx->ctx,o_mov64,sQWORD,rEBX,0,rEAX);
        uVar17 = uVar17 + 0xf & 0xfffffff0;
        EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_add64,sQWORD,rR13,0x108,uVar17);
        EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_add64,sQWORD,rR13,0x140,
                         pEVar5->regVmRegisters << 3);
        EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
        iVar2 = pEVar5->regVmRegisters;
        if (iVar2 < 5) {
          bVar24 = false;
        }
        else if (iVar2 - 4U < 9) {
          uVar16 = 0x20;
          for (iVar21 = 4; iVar21 < iVar2; iVar21 = iVar21 + 1) {
            EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_mov64,sQWORD,rEBX,uVar16,0);
            iVar2 = pEVar5->regVmRegisters;
            uVar16 = uVar16 + 8;
          }
          bVar24 = false;
          pFVar22 = local_80;
        }
        else {
          EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
          EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_lea,rEDI,sQWORD,rEBX,0x20);
          EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_mov,rECX,iVar2 - 4U);
          bVar24 = true;
          EMIT_OP(&this->codeGenCtx->ctx,o_rep_stosq);
        }
        pFVar18 = local_98;
        pFVar20 = local_a0;
        uVar17 = uVar17 - uVar15;
        if (uVar17 != 0) {
          if ((uVar17 & 3) != 0) {
            __assert_fail("count % 4 == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                          ,0x5c3,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
          }
          if (uVar17 < 0x11) {
            uVar17 = uVar17 >> 2;
            while (bVar24 = uVar17 != 0, uVar17 = uVar17 - 1, bVar24) {
              EMIT_OP_RPTR_NUM(&this->codeGenCtx->ctx,o_mov,sDWORD,rR15,uVar15,0);
              uVar15 = uVar15 + 4;
            }
          }
          else {
            if (!bVar24) {
              EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
            }
            EMIT_OP_REG_RPTR(&this->codeGenCtx->ctx,o_lea,rEDI,sQWORD,rR15,uVar15);
            EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_mov,rECX,uVar17 >> 2);
            EMIT_OP(&this->codeGenCtx->ctx,o_rep_stosd);
          }
        }
      }
    }
    pRVar7 = local_60;
    if ((local_60->code == '\x1d') && (local_60->rA != '\0')) {
      puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,local_60->argument);
      *(byte *)puVar4 = (byte)*puVar4 | 4;
      if (local_8c != 0) {
        FastVector<unsigned_int,_false,_false>::push_back(local_78,&pos);
      }
      FastVector<unsigned_int,_false,_false>::push_back(local_78,&pRVar7->argument);
      if (pos != 0) {
        EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_add64,rESP,0x28);
        EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rR15);
        EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rEBX);
      }
    }
    pos = pos + 1;
    (**(code **)(NULLC::cgFuncs + (ulong)pRVar7->code * 8))(this->codeGenCtx,*pRVar7);
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&this->codeGenCtx->ctx,
               this->exRegVmRegKillInfo->data + this->codeGenCtx->currInstructionRegKillOffset);
    CodeGenGenericContext::UnlockRegisters(&this->codeGenCtx->ctx);
    SetOptimizationLookBehind(&this->codeGenCtx->ctx,true);
  }
  FastVector<unsigned_int,_false,_false>::push_back(local_78,&pos);
  ((this->codeGenCtx->ctx).x86Op)->instID = pos + 1;
  puVar4 = FastVector<unsigned_int,_false,_false>::operator[](pFVar20,this->exRegVmCode->count);
  if ((*puVar4 & 6) != 0) {
    EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,0);
    EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rEBX);
    EMIT_OP_REG(&this->codeGenCtx->ctx,o_push,rR15);
    EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_sub64,rESP,0x28);
    EMIT_OP_NUM(&this->codeGenCtx->ctx,o_set_tracking,1);
  }
  EMIT_OP_REG_REG(&this->codeGenCtx->ctx,o_xor,rEAX,rEAX);
  EMIT_OP_REG_NUM(&this->codeGenCtx->ctx,o_add64,rESP,0x28);
  EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rR15);
  EMIT_OP_REG(&this->codeGenCtx->ctx,o_pop,rEBX);
  EMIT_OP(&this->codeGenCtx->ctx,o_ret);
  FastVector<unsigned_int,_false,_false>::pop_back(pFVar20);
  pxVar14 = (this->codeGenCtx->ctx).x86Op;
  pxVar9 = FastVector<x86Instruction,_true,_true>::operator[](pFVar22,0);
  FastVector<x86Instruction,_true,_true>::resize
            (pFVar22,(uint)(((long)pxVar14 - (long)pxVar9) / 0x50));
  info.data = (uchar **)((ulong)info.data & 0xffffffff00000000);
  FastVector<unsigned_int,_false,_false>::push_back(pFVar20,(uint *)&info);
  if ((char)local_6c != '\0') {
    if (local_88->stream != (void *)0x0) {
      __assert_fail("!output.stream",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                    ,0x669,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
    }
    pvVar10 = (*local_88->openStream)("asmX86.txt");
    local_88->stream = pvVar10;
    if (pvVar10 != (void *)0x0) {
      SaveListing(this,local_88);
      (*local_88->closeStream)(local_88->stream);
      local_88->stream = (void *)0x0;
    }
  }
  FastVector<unsigned_int,_false,_false>::pop_back(pFVar20);
  uVar17 = this->binCodeSize;
  uVar15 = this->binCodeReserved;
  uVar16 = uVar17 + (this->instList).count * 8;
  if (uVar15 < uVar16) {
    this->binCodeReserved = uVar16 + 0x1000;
    puVar11 = (uchar *)(*(code *)NULLC::alloc)();
    if ((this->binCode != (uchar *)0x0) && (this->codeRunning == false)) {
      NULLC::MemProtect(this->binCode,uVar15,3);
    }
    NULLC::MemProtect(puVar11,this->binCodeReserved,7);
    if ((ulong)this->binCodeSize != 0) {
      NULLC::copyMemory(puVar11,this->binCode,(ulong)this->binCodeSize);
    }
    cVar19 = this->codeRunning;
    if ((bool)cVar19 == true) {
      info.data = (uchar **)this->binCode;
      (this->functionWin64UnwindTable).data = (_RUNTIME_FUNCTION *)0x0;
      (this->functionWin64UnwindTable).max = 0;
      (this->functionWin64UnwindTable).count = 0;
      info.count = uVar15;
      FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::push_back
                (&this->expiredCodeBlocks,(ExpiredCodeBlock *)&info);
    }
    else {
      (*(code *)NULLC::dealloc)(this->binCode);
    }
    for (uVar15 = 0; pFVar18 = local_98, uVar15 < (this->instAddress).count; uVar15 = uVar15 + 1) {
      ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->instAddress,uVar15);
      puVar23 = *ppuVar12;
      puVar1 = this->binCode;
      ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[](&this->instAddress,uVar15);
      *ppuVar12 = puVar11 + ((long)puVar23 - (long)puVar1);
    }
    for (uVar15 = 0; uVar15 < (this->functionAddress).count; uVar15 = uVar15 + 1) {
      ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[](pFVar18,uVar15);
      if (*ppuVar12 != (uchar *)0x0) {
        ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[](pFVar18,uVar15);
        puVar23 = *ppuVar12;
        puVar1 = this->binCode;
        ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[](pFVar18,uVar15);
        *ppuVar12 = puVar11 + ((long)puVar23 - (long)puVar1);
      }
    }
    for (uVar15 = 0; uVar15 < (this->expiredFunctionAddressLists).count; uVar15 = uVar15 + 1) {
      pEVar13 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::operator[]
                          (&this->expiredFunctionAddressLists,uVar15);
      uVar17 = pEVar13->count;
      for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
        puVar23 = pEVar13->data[uVar8];
        if (puVar23 != (uchar *)0x0) {
          pEVar13->data[uVar8] = puVar11 + ((long)puVar23 - (long)this->binCode);
        }
      }
    }
    this->binCode = puVar11;
    uVar17 = this->binCodeSize;
    pFVar18 = local_98;
  }
  else {
    puVar11 = this->binCode;
    cVar19 = '\0';
  }
  puVar23 = puVar11 + ((ulong)uVar17 - 10);
  if (uVar17 == 0) {
    puVar23 = puVar11;
  }
  this_00 = &this->instAddress;
  FastVector<unsigned_char_*,_false,_false>::resize(this_00,this->exRegVmCode->count + 1);
  NULLC::fillMemory((this->instAddress).data + this->lastInstructionCount,0,
                    (ulong)((this->exRegVmCode->count - this->lastInstructionCount) + 1) << 3);
  (this->vmState).instAddress = (this->instAddress).data;
  x86ClearLabels();
  x86ReserveLabels(this->codeGenCtx->labelCount);
  puVar11 = x86TranslateInstructionList
                      (puVar23,this->binCode + this->binCodeReserved,(this->instList).data,
                       (this->instList).count,(this->instAddress).data);
  if (this->binCodeReserved <= this->binCodeSize) {
    __assert_fail("binCodeSize < binCodeReserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                  ,0x756,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
  }
  uVar15 = (int)puVar11 - *(int *)&this->binCode;
  this->binCodeSize = uVar15;
  if (this->binCodeReserved <= uVar15) {
    __assert_fail("unsigned(code - binCode) < binCodeReserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                  ,0x7af,"bool ExecutorX86::TranslateToNative(bool, OutputContext &)");
  }
  x86SatisfyJumps(this_00);
  uVar15 = 0;
  if (cVar19 == '\0') {
    uVar15 = this->oldFunctionSize;
  }
  while( true ) {
    uVar17 = this->exFunctions->count;
    if (uVar17 <= uVar15) break;
    pEVar5 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,uVar15);
    if (pEVar5->regVmAddress == -1) {
      puVar11 = (uchar *)0x0;
    }
    else {
      pEVar5 = FastVector<ExternFuncInfo,_false,_false>::operator[](this->exFunctions,uVar15);
      ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[](this_00,pEVar5->regVmAddress)
      ;
      puVar11 = *ppuVar12;
    }
    ppuVar12 = FastVector<unsigned_char_*,_false,_false>::operator[](pFVar18,uVar15);
    *ppuVar12 = puVar11;
    uVar15 = uVar15 + 1;
  }
  this->lastInstructionCount = this->exRegVmCode->count;
  this->oldJumpTargetCount = (this->exLinker->regVmJumpTargets).count;
  this->oldRegKillInfoCount = this->exRegVmRegKillInfo->count;
  this->oldFunctionSize = uVar17;
  NULLC::TraceScope::~TraceScope(&traceScope);
  return true;
}

Assistant:

bool ExecutorX86::TranslateToNative(bool enableLogFiles, OutputContext &output)
{
	TRACE_SCOPE("x86", "TranslateToNative");

	if(instList.size())
		NULLC::fillMemory(instList.data, 0, sizeof(x86Instruction) * instList.size());
	instList.clear();
	instList.reserve(64);

	if(!codeGenCtx)
		codeGenCtx = NULLC::construct<CodeGenRegVmContext>();

	codeGenCtx->x86rvm = this;

	codeGenCtx->exFunctions = exFunctions.data;
	codeGenCtx->exTypes = exTypes.data;
	codeGenCtx->exTypeExtra = exLinker->exTypeExtra.data;
	codeGenCtx->exLocals = exLinker->exLocals.data;
	codeGenCtx->exRegVmConstants = exRegVmConstants.data;
	codeGenCtx->exRegVmConstantsEnd = exRegVmConstants.data + exRegVmConstants.count;
	codeGenCtx->exRegVmRegKillInfo = exRegVmRegKillInfo.data;
	codeGenCtx->exSymbols = exLinker->exSymbols.data;

	codeGenCtx->vmState = &vmState;

	vmState.ctx = codeGenCtx;
	vmState.exRegVmConstants = exRegVmConstants.data;

	codeGenCtx->ctx.SetLastInstruction(instList.data, instList.data);

	CommonSetLinker(exLinker);

	EMIT_OP(codeGenCtx->ctx, o_use32);

	codeJumpTargets.resize(exRegVmCode.size());
	if(codeJumpTargets.size())
		NULLC::fillMemory(&codeJumpTargets[lastInstructionCount], 0, (codeJumpTargets.size() - lastInstructionCount) * sizeof(codeJumpTargets[0]));

	// Mirror extra global return so that jump to global return can be marked (rviNop, because we will have some custom code)
	codeJumpTargets.push_back(0);
	for(unsigned i = oldJumpTargetCount, e = exLinker->regVmJumpTargets.size(); i != e; i++)
		codeJumpTargets[exLinker->regVmJumpTargets[i]] = 1;

	// Mark function locations
	for(unsigned i = 0, e = exLinker->exFunctions.size(); i != e; i++)
	{
		ExternFuncInfo &target = exLinker->exFunctions[i];

		if(target.regVmAddress != -1 && target.regVmCodeSize != 0 && (codeJumpTargets[target.regVmAddress] >> 8) == 0)
			codeJumpTargets[target.regVmAddress] |= 2 + (i << 8);
	}

	// Find instruction register kill info positions
	codeRegKillInfoOffsets.resize(exRegVmCode.size());
	for(unsigned i = lastInstructionCount, e = exRegVmCode.size(); i != e; i++)
	{
		codeRegKillInfoOffsets[i] = oldRegKillInfoCount;

		unsigned counts = exRegVmRegKillInfo[oldRegKillInfoCount];

		oldRegKillInfoCount += 1 + (counts >> 4) + (counts & 0xf);
	}
	assert(oldRegKillInfoCount == exRegVmRegKillInfo.size());

	if(codeRunning && exFunctions.size() >= functionAddress.max)
	{
		ExpiredFunctionAddressList info;

		info.data = functionAddress.data;
		info.count = functionAddress.count;

		expiredFunctionAddressLists.push_back(info);

		functionAddress.data = NULL;
		functionAddress.count = 0;
		functionAddress.max = 0;

		functionAddress.resize(exFunctions.size());

		for(unsigned int i = 0; i < oldFunctionSize; i++)
		{
			if(exFunctions[i].regVmAddress != -1)
				functionAddress[i] = instAddress[exFunctions[i].regVmAddress];
			else
				functionAddress[i] = 0;
		}
	}
	else
	{
		functionAddress.resize(exFunctions.size());
	}

	vmState.functionAddress = functionAddress.data;

	SetOptimizationLookBehind(codeGenCtx->ctx, false);

	unsigned activeGlobalCodeStart = 0;

	unsigned int pos = lastInstructionCount;
	while(pos < exRegVmCode.size())
	{
		RegVmCmd &cmd = exRegVmCode[pos];

		unsigned int currSize = (int)(codeGenCtx->ctx.GetLastInstruction() - instList.data);
		instList.count = currSize;
		if(currSize + 64 >= instList.max)
			instList.grow(currSize + 64);

		codeGenCtx->ctx.SetLastInstruction(instList.data + currSize, instList.data);

		codeGenCtx->ctx.GetLastInstruction()->instID = pos + 1;

		if(codeJumpTargets[pos])
			SetOptimizationLookBehind(codeGenCtx->ctx, false);

		codeGenCtx->currInstructionPos = pos;
		codeGenCtx->currInstructionRegKillOffset = codeRegKillInfoOffsets[pos];

		// Frame setup
		if((codeJumpTargets[pos] & 6) != 0)
		{
			if(codeJumpTargets[pos] & 4)
			{
				activeGlobalCodeStart = pos;

				codeGenCtx->currFunctionId = 0;
			}

			EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

#if defined(_M_X64)
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rRBX);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rR15);
			EMIT_OP_REG_NUM(codeGenCtx->ctx, o_sub64, rRSP, 40);
#else
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBP);
			EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rEBP, rESP);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBX);
			EMIT_OP_REG(codeGenCtx->ctx, o_push, rESI);
#endif

			EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

			// Generate function prologue (register cleanup, data stack advance, data stack cleanup)
			if(codeJumpTargets[pos] & 2)
			{
				codeGenCtx->currFunctionId = codeJumpTargets[pos] >> 8;

				ExternFuncInfo &target = exLinker->exFunctions[codeGenCtx->currFunctionId];

				unsigned stackSize = (target.stackSize + 0xf) & ~0xf;
				unsigned argumentsSize = target.argumentSize;

#if defined(_M_X64)
				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rRBX, sQWORD, rR13, nullcOffsetOf(&vmState, regFileLastTop));
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rR15, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackTop));

				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov64, rRAX, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackBase));
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, o_mov64, sQWORD, rRBX, 0, rRAX);

				// Advance frame top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add64, sQWORD, rR13, nullcOffsetOf(&vmState, dataStackTop), stackSize); // vmState->dataStackTop += stackSize;

				// Advance register top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add64, sQWORD, rR13, nullcOffsetOf(&vmState, regFileLastTop), target.regVmRegisters * 8); // vmState->regFileLastTop += target.regVmRegisters;

				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

				bool isRaxCleared = false;

				// Clear register values
				if (target.regVmRegisters > rvrrCount)
				{
					unsigned count = target.regVmRegisters - rvrrCount;

					if(count <= 8)
					{
						for(int regId = rvrrCount; regId < target.regVmRegisters; regId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov64, sQWORD, rRBX, regId * 8, 0);
					}
					else
					{
						isRaxCleared = true;

						EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rRAX, rRAX);
						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rRDI, sQWORD, rRBX, rvrrCount * 8);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosq);
					}
				}

				// Clear data stack
				// TODO: use target.stackSize which is smaller?
				if(unsigned count = stackSize - argumentsSize)
				{
					assert(count % 4 == 0);

					if(count <= 16)
					{
						for(unsigned dataId = 0; dataId < count / 4; dataId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rR15, argumentsSize + dataId * 4, 0);
					}
					else
					{
						if(!isRaxCleared)
							EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rRAX, rRAX);

						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rRDI, sQWORD, rR15, argumentsSize);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count / 4);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}
#else
				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

				EMIT_OP_REG_ADDR(codeGenCtx->ctx, o_mov, rEBX, sDWORD, uintptr_t(&vmState.regFileLastTop));
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_mov, rESI, sDWORD, rNONE, 1, rEBX, rvrrFrame * 8);

				// Advance frame top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add, sDWORD, uintptr_t(&vmState.dataStackTop), stackSize); // vmState->dataStackTop += stackSize;

				// Advance register top
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_add, sDWORD, uintptr_t(&vmState.regFileLastTop), target.regVmRegisters * 8); // vmState->regFileLastTop += target.regVmRegisters;

				EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);

				bool isEaxCleared = false;

				// Clear register values
				if(target.regVmRegisters > rvrrCount)
				{
					unsigned count = target.regVmRegisters - rvrrCount;

					if(count <= 4)
					{
						for(int regId = rvrrCount; regId < target.regVmRegisters; regId++)
						{
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rEBX, regId * 8, 0);
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rEBX, regId * 8, 4);
						}
					}
					else
					{
						isEaxCleared = true;

						EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);
						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rEDI, sDWORD, rEBX, rvrrCount * 8);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count * 2);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}

				// Clear data stack
				// TODO: use target.stackSize which is smaller?
				if(unsigned count = stackSize - argumentsSize)
				{
					assert(count % 4 == 0);

					if(count <= 16)
					{
						for(unsigned dataId = 0; dataId < count / 4; dataId++)
							EMIT_OP_RPTR_NUM(codeGenCtx->ctx, o_mov, sDWORD, rESI, argumentsSize + dataId * 4, 0);
					}
					else
					{
						if(!isEaxCleared)
							EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);

						EMIT_OP_REG_RPTR(codeGenCtx->ctx, o_lea, rEDI, sDWORD, rESI, argumentsSize);
						EMIT_OP_REG_NUM(codeGenCtx->ctx, o_mov, rECX, count / 4);
						EMIT_OP(codeGenCtx->ctx, o_rep_stosd);
					}
				}
#endif
			}
		}

		if(cmd.code == rviJmp && cmd.rA)
		{
			codeJumpTargets[cmd.argument] |= 4;

			if(activeGlobalCodeStart != 0)
				globalCodeRanges.push_back(pos);

			globalCodeRanges.push_back(cmd.argument);

			if(pos)
			{
#if defined(_M_X64)
				EMIT_OP_REG_NUM(codeGenCtx->ctx, o_add64, rRSP, 40);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rR15);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rRBX);
#else
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rESI);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBX);
				EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rESP, rEBP);
				EMIT_REG_READ(codeGenCtx->ctx, rESP);
				EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBP);
#endif
			}
		}

		pos++;

		NULLC::cgFuncs[cmd.code](*codeGenCtx, cmd);

		codeGenCtx->ctx.KillLateUnreadRegVmRegisters(exRegVmRegKillInfo.data + codeGenCtx->currInstructionRegKillOffset);
		codeGenCtx->ctx.UnlockRegisters();

		SetOptimizationLookBehind(codeGenCtx->ctx, true);
	}

	globalCodeRanges.push_back(pos);

	// Add extra global return if there is none
	codeGenCtx->ctx.GetLastInstruction()->instID = pos + 1;

	if((codeJumpTargets[exRegVmCode.size()] & 6) != 0)
	{
		EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 0);

#if defined(_M_X64)
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rRBX);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rR15);
		EMIT_OP_REG_NUM(codeGenCtx->ctx, o_sub64, rRSP, 40);
#else
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBP);
		EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rEBP, rESP);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rEBX);
		EMIT_OP_REG(codeGenCtx->ctx, o_push, rESI);
#endif

		EMIT_OP_NUM(codeGenCtx->ctx, o_set_tracking, 1);
	}

	EMIT_OP_REG_REG(codeGenCtx->ctx, o_xor, rEAX, rEAX);

#if defined(_M_X64)
	EMIT_OP_REG_NUM(codeGenCtx->ctx, o_add64, rRSP, 40);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rR15);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rRBX);
#else
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rESI);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBX);
	EMIT_OP_REG_REG(codeGenCtx->ctx, o_mov, rESP, rEBP);
	EMIT_REG_READ(codeGenCtx->ctx, rESP);
	EMIT_OP_REG(codeGenCtx->ctx, o_pop, rEBP);
#endif

	EMIT_OP(codeGenCtx->ctx, o_ret);

	// Remove rviNop, because we don't want to generate code for it
	codeJumpTargets.pop_back();

	instList.resize((int)(codeGenCtx->ctx.GetLastInstruction() - &instList[0]));

	// Once again, mirror extra global return so that jump to global return can be marked (cmdNop, because we will have some custom code)
	codeJumpTargets.push_back(false);

	if(enableLogFiles)
	{
		assert(!output.stream);
		output.stream = output.openStream("asmX86.txt");

		if(output.stream)
		{
			SaveListing(output);

			output.closeStream(output.stream);
			output.stream = NULL;
		}
	}

#if defined(NULLC_OPTIMIZE_X86) && 0
	// Second optimization pass, just feed generated instructions again

	// Set iterator at beginning
	codeGenCtx->ctx.SetLastInstruction(instList.data, instList.data);
	SetOptimizationLookBehind(codeGenCtx->ctx, false);
	// Now regenerate instructions
	for(unsigned int i = 0; i < instList.size(); i++)
	{
		x86Instruction &inst = instList[i];

		// Skip trash
		if(inst.name == o_none)
		{
			EMIT_OP(codeGenCtx->ctx, o_none);
			continue;
		}
		// If invalidation flag is set
		if(inst.instID && codeJumpTargets[inst.instID - 1])
			SetOptimizationLookBehind(codeGenCtx->ctx, false);

		if(inst.name == o_label)
		{
			EMIT_LABEL(codeGenCtx->ctx, inst.labelID, inst.argA.num);
			SetOptimizationLookBehind(codeGenCtx->ctx, true);
			continue;
		}

		switch(inst.argA.type)
		{
		case x86Argument::argNone:
			EMIT_OP(codeGenCtx->ctx, inst.name);
			break;
		case x86Argument::argNumber:
			EMIT_OP_NUM(codeGenCtx->ctx, inst.name, inst.argA.num);
			break;
		case x86Argument::argLabel:
			EMIT_OP_LABEL(codeGenCtx->ctx, inst.name, inst.argA.labelID, inst.argB.num, inst.argB.ptrNum);
			break;
		case x86Argument::argReg:
			switch(inst.argB.type)
			{
			case x86Argument::argNone:
				EMIT_OP_REG(codeGenCtx->ctx, inst.name, inst.argA.reg);
				break;
			case x86Argument::argNumber:
				EMIT_OP_REG_NUM(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.num);
				break;
			case x86Argument::argReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.reg);
				break;
			case x86Argument::argPtr:
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.ptrSize, inst.argB.ptrIndex, inst.argB.ptrMult, inst.argB.ptrBase, inst.argB.ptrNum);
				break;
			case x86Argument::argImm64:
				EMIT_OP_REG_NUM64(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.imm64Arg);
				break;
			case x86Argument::argXmmReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.reg, inst.argB.xmmArg);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		case x86Argument::argPtr:
			switch(inst.argB.type)
			{
			case x86Argument::argNone:
				EMIT_OP_RPTR(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum);
				break;
			case x86Argument::argNumber:
				EMIT_OP_RPTR_NUM(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.num);
				break;
			case x86Argument::argReg:
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.reg);
				break;
			case x86Argument::argXmmReg:
				EMIT_OP_RPTR_REG(codeGenCtx->ctx, inst.name, inst.argA.ptrSize, inst.argA.ptrIndex, inst.argA.ptrMult, inst.argA.ptrBase, inst.argA.ptrNum, inst.argB.xmmArg);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		case x86Argument::argXmmReg:
			switch(inst.argB.type)
			{
			case x86Argument::argXmmReg:
				EMIT_OP_REG_REG(codeGenCtx->ctx, inst.name, inst.argA.xmmArg, inst.argB.xmmArg);
				break;
			case x86Argument::argPtr:
				EMIT_OP_REG_RPTR(codeGenCtx->ctx, inst.name, inst.argA.xmmArg, inst.argB.ptrSize, inst.argB.ptrIndex, inst.argB.ptrMult, inst.argB.ptrBase, inst.argB.ptrNum);
				break;
			default:
				assert(!"unknown type");
				break;
			}
			break;
		default:
			assert(!"unknown type");
			break;
		}

		SetOptimizationLookBehind(codeGenCtx->ctx, true);
	}

	unsigned int currSize = (int)(codeGenCtx->ctx.GetLastInstruction() - &instList[0]);
	for(unsigned int i = currSize; i < instList.size(); i++)
	{
		instList[i].name = o_other;
		instList[i].instID = 0;
	}

	if(enableLogFiles)
	{
		assert(!output.stream);
		output.stream = output.openStream("asmX86_opt.txt");

		if(output.stream)
		{
			SaveListing(output);

			output.closeStream(output.stream);
			output.stream = NULL;
		}
	}
#endif

	codeJumpTargets.pop_back();

	bool codeRelocated = false;

	if((binCodeSize + instList.size() * 8) > binCodeReserved)
	{
		unsigned int oldBinCodeReserved = binCodeReserved;
		binCodeReserved = binCodeSize + (instList.size()) * 8 + 4096;	// Average instruction size is 8 bytes.
		unsigned char *binCodeNew = (unsigned char*)NULLC::alloc(binCodeReserved);

		// Disable execution of old code body and enable execution of new code body
#ifndef __linux
		DWORD unusedProtect;
		if(binCode && !codeRunning)
			VirtualProtect((void*)binCode, oldBinCodeReserved, oldCodeBodyProtect, (DWORD*)&unusedProtect);
		VirtualProtect((void*)binCodeNew, binCodeReserved, PAGE_EXECUTE_READWRITE, (DWORD*)&oldCodeBodyProtect);
#else
		if(binCode && !codeRunning)
			NULLC::MemProtect((void*)binCode, oldBinCodeReserved, PROT_READ | PROT_WRITE);
		NULLC::MemProtect((void*)binCodeNew, binCodeReserved, PROT_READ | PROT_WRITE | PROT_EXEC);
#endif

		if(binCodeSize)
			NULLC::copyMemory(binCodeNew, binCode, binCodeSize);

		// If code is currently running, update all instruction pointers
		if(codeRunning)
		{
			codeRelocated = true;

			ExpiredCodeBlock block;

			block.code = binCode;
			block.codeSize = oldBinCodeReserved;

#ifdef _M_X64
			block.unwindTable = functionWin64UnwindTable.data;

			functionWin64UnwindTable.data = NULL;
			functionWin64UnwindTable.count = 0;
			functionWin64UnwindTable.max = 0;
#endif

			expiredCodeBlocks.push_back(block);
		}
		else
		{
			NULLC::dealloc(binCode);
		}

		for(unsigned i = 0; i < instAddress.size(); i++)
			instAddress[i] = (instAddress[i] - binCode) + binCodeNew;

		for(unsigned i = 0; i < functionAddress.size(); i++)
		{
			if(functionAddress[i])
				functionAddress[i] = uintptr_t(functionAddress[i] - binCode) + binCodeNew;
		}

		for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
		{
			ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

			for(unsigned k = 0; k < info.count; k++)
			{
				if(info.data[k])
					info.data[k] = uintptr_t(info.data[k] - binCode) + binCodeNew;
			}
		}

		binCode = binCodeNew;
	}

	// Translate to x86
	unsigned char *code = binCode + binCodeSize;

	// Linking in new code, destroy final global return code sequence
	if(binCodeSize != 0)
	{
#if defined(_M_X64)
		code -= 10; // xor eax, eax; add rsp, 40; pop r15; pop rbx; ret;
#else
		code -= 8; // xor eax, eax; mov esp, ebp; pop esi; pop ebx; pop ebp; ret;
#endif
	}

	instAddress.resize(exRegVmCode.size() + 1); // Extra instruction for global return
	NULLC::fillMemory(instAddress.data + lastInstructionCount, 0, (exRegVmCode.size() - lastInstructionCount + 1) * sizeof(instAddress[0]));

	vmState.instAddress = instAddress.data;

	x86ClearLabels();
	x86ReserveLabels(codeGenCtx->labelCount);

	code = x86TranslateInstructionList(code, binCode + binCodeReserved, instList.data, instList.size(), instAddress.data);

	assert(binCodeSize < binCodeReserved);

	binCodeSize = unsigned(code - binCode);

#ifndef __linux

#if defined(_M_X64)
	// Create function table for unwind information
	if(!functionWin64UnwindTable.empty())
		RtlDeleteFunctionTable(functionWin64UnwindTable.data);

	functionWin64UnwindTable.clear();

	// Align data block
	code += 16 - unsigned(uintptr_t(code) % 16);

	// Write the unwind data
	assert(sizeof(UNWIND_CODE) == 2);
	assert(sizeof(UNWIND_INFO_FUNCTION) == 4 + 4 * 2);

	UNWIND_INFO_FUNCTION unwindInfo = { 0 };

	unwindInfo.version = 1;
	unwindInfo.flags = 0; // No EH
	unwindInfo.sizeOfProlog = 7;
	unwindInfo.countOfCodes = 3;
	unwindInfo.frameRegister = 0;
	unwindInfo.frameOffset = 0;

	unwindInfo.unwindCode[0].offsetInPrologue = 7;
	unwindInfo.unwindCode[0].operationCode = UWOP_ALLOC_SMALL;
	unwindInfo.unwindCode[0].operationInfo = (40 - 8) / 8;

	unwindInfo.unwindCode[1].offsetInPrologue = 3;
	unwindInfo.unwindCode[1].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[1].operationInfo = 15; // r15

	unwindInfo.unwindCode[2].offsetInPrologue = 1;
	unwindInfo.unwindCode[2].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[2].operationInfo = UWOP_REGISTER_RBX;

	unsigned char *unwindPos = code;

	NULLC::copyMemory(code, &unwindInfo, sizeof(unwindInfo));
	code += sizeof(unwindInfo);

	assert(code < binCode + binCodeReserved);

	for(unsigned i = 0, e = exLinker->exFunctions.size(); i != e; i++)
	{
		ExternFuncInfo &funcInfo = exLinker->exFunctions[i];

		if(funcInfo.regVmAddress != ~0u)
		{
			unsigned char *codeStart = instAddress[funcInfo.regVmAddress];
			unsigned char *codeEnd = instAddress[funcInfo.regVmAddress + funcInfo.regVmCodeSize];

			// Store function info
			RUNTIME_FUNCTION rtFunc;

			rtFunc.BeginAddress = unsigned(codeStart - binCode);
			rtFunc.EndAddress = unsigned(codeEnd - binCode);
			rtFunc.UnwindData = unsigned(unwindPos - binCode);

			functionWin64UnwindTable.push_back(rtFunc);
		}
	}

	for(unsigned i = 0, e = globalCodeRanges.size(); i != e; i += 2)
	{
		unsigned char *codeStart = instAddress[globalCodeRanges[i]];
		unsigned char *codeEnd = instAddress[globalCodeRanges[i + 1]] + unwindInfo.sizeOfProlog; // Add prologue

		// Store function info
		RUNTIME_FUNCTION rtFunc;

		rtFunc.BeginAddress = unsigned(codeStart - binCode);
		rtFunc.EndAddress = unsigned(codeEnd - binCode);
		rtFunc.UnwindData = unsigned(unwindPos - binCode);

		functionWin64UnwindTable.push_back(rtFunc);
	}

	if(!RtlAddFunctionTable(functionWin64UnwindTable.data, functionWin64UnwindTable.size(), uintptr_t(binCode)))
		assert(!"failed to install function table");
#endif

#endif

	assert(unsigned(code - binCode) < binCodeReserved);

	x86SatisfyJumps(instAddress);

	for(unsigned int i = (codeRelocated ? 0 : oldFunctionSize); i < exFunctions.size(); i++)
	{
		if(exFunctions[i].regVmAddress != -1)
			functionAddress[i] = instAddress[exFunctions[i].regVmAddress];
		else
			functionAddress[i] = 0;
	}

	lastInstructionCount = exRegVmCode.size();

	oldJumpTargetCount = exLinker->regVmJumpTargets.size();
	oldRegKillInfoCount = exRegVmRegKillInfo.size();
	oldFunctionSize = exFunctions.size();

	return true;
}